

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTSayIntentions.cpp
# Opt level: O2

string * __thiscall
SayIntentionsConnection::UnprocessCallSign
          (string *__return_storage_ptr__,SayIntentionsConnection *this,string *cs)

{
  pointer s;
  allocator<char> local_71 [9];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  t;
  string local_50;
  
  std::__cxx11::string::find((char *)cs,0x2407b0);
  std::__cxx11::string::substr((ulong)&local_50,(ulong)cs);
  std::__cxx11::string::operator=((string *)cs,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"-",local_71);
  str_tokenize(&t,cs,&local_50,true);
  std::__cxx11::string::~string((string *)&local_50);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (s = t.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      s != t.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish; s = s + 1) {
    str_tolower_c(&local_50,s);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::at(&mapTokens_abi_cxx11_,&local_50);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if ((__return_storage_ptr__->_M_string_length != 0) &&
     ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] ==
      ' ')) {
    std::__cxx11::string::pop_back();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&t);
  return __return_storage_ptr__;
}

Assistant:

std::string SayIntentionsConnection::UnprocessCallSign (std::string cs)
{
    // The call sign can be extended by something that looks like a tail number, remove that
    cs = cs.substr(0, cs.find(" "));
    
    // Cut it into pieces by the dash
    std::vector<std::string> t = str_tokenize(cs, "-");
    
    // Walk the tokens and let's see what we can convert
    std::string ret;
    for (const std::string& s: t)
    {
        try {
            ret += mapTokens.at(str_tolower_c(s));  // replace the token
        }
        catch (...)                             // didn't find token in map
        {
            if (!ret.empty()) ret += ' ';
            ret += s;                           // add it as is
            ret += ' ';                         // and separate by space
        }
    }
    
    // Remove a trailing space
    if (!ret.empty() && ret.back() == ' ')
        ret.pop_back();
    
    return ret;
}